

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cmd.cpp
# Opt level: O2

void FS_EmulateCmd(char *string)

{
  char *__s1;
  double dVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  FScanner sc;
  char local_88 [88];
  
  FScanner::FScanner(&sc);
  sVar4 = strlen(string);
  FScanner::OpenMem(&sc,"RUNCMD",string,(int)sVar4);
LAB_005f0404:
  do {
    while( true ) {
      bVar2 = FScanner::GetString(&sc);
      if (!bVar2) {
        FScanner::~FScanner(&sc);
        return;
      }
      bVar2 = FScanner::Compare(&sc,"GIMME");
      if (!bVar2) break;
      while( true ) {
        bVar2 = FScanner::GetString(&sc);
        if ((!bVar2) || (bVar2 = FScanner::Compare(&sc,";"), __s1 = sc.String, bVar2)) break;
        iVar3 = strncasecmp(sc.String,"health",6);
        pcVar5 = "health";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"ammo",4);
        pcVar5 = "ammo";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"armor",5);
        pcVar5 = "greenarmor";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"keys",4);
        pcVar5 = "keys";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"weapons",7);
        pcVar5 = "weapons";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"chainsaw",8);
        pcVar5 = "chainsaw";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"shotgun",7);
        pcVar5 = "shotgun";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"supershotgun",0xc);
        pcVar5 = "supershotgun";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"rocket",6);
        pcVar5 = "rocketlauncher";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"plasma",6);
        pcVar5 = "plasmarifle";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"bfg",3);
        pcVar5 = "BFG9000";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"chaingun",8);
        pcVar5 = "chaingun";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"berserk",7);
        pcVar5 = "Berserk";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"map",3);
        pcVar5 = "Allmap";
        if (iVar3 == 0) goto LAB_005f0620;
        iVar3 = strncasecmp(__s1,"fullmap",7);
        pcVar5 = "Allmap";
        if (iVar3 == 0) {
LAB_005f0620:
          mysnprintf(local_88,0x50,"give %.72s",pcVar5);
          AddCommandString(local_88,0);
        }
      }
    }
    bVar2 = FScanner::Compare(&sc,"ALLOWJUMP");
    if (bVar2) {
      FScanner::MustGetNumber(&sc);
      FIntCVar::operator=(&dmflags,(uint)(sc.Number == 0) << 0x10 | dmflags.Value & 0xfffeffffU);
      do {
        bVar2 = FScanner::GetString(&sc);
        if (!bVar2) break;
        bVar2 = FScanner::Compare(&sc,";");
      } while (!bVar2);
      goto LAB_005f0404;
    }
    bVar2 = FScanner::Compare(&sc,"gravity");
    if (bVar2) {
      FScanner::MustGetFloat(&sc);
      level.gravity = (double)(float)(sc.Float * 800.0);
      do {
        bVar2 = FScanner::GetString(&sc);
        if (!bVar2) break;
        bVar2 = FScanner::Compare(&sc,";");
      } while (!bVar2);
    }
    else {
      bVar2 = FScanner::Compare(&sc,"viewheight");
      if (bVar2) {
        FScanner::MustGetFloat(&sc);
        dVar1 = sc.Float;
        for (lVar6 = 0; lVar6 != 0x1500; lVar6 = lVar6 + 0x2a0) {
          if (*(long *)((long)&players + lVar6) != 0) {
            *(double *)(*(long *)((long)&players + lVar6) + 0x4e0) = dVar1;
          }
          *(double *)((long)&DAT_009ba488 + lVar6) = dVar1;
          player_t::Uncrouch((player_t *)((long)&players + lVar6));
        }
        do {
          bVar2 = FScanner::GetString(&sc);
          if (!bVar2) break;
          bVar2 = FScanner::Compare(&sc,";");
        } while (!bVar2);
      }
      else {
        bVar2 = FScanner::Compare(&sc,"map");
        if (bVar2) {
          FS_MapCmd(&sc);
        }
        else {
          bVar2 = FScanner::Compare(&sc,"gr_fogdensity");
          if (bVar2) {
            FScanner::MustGetNumber(&sc);
            (*Renderer->_vptr_FRenderer[0x15])
                      (Renderer,(long)(sc.Number * 0x46) / 400 & 0xffffffff,0xff000000,0,0);
          }
          else {
            bVar2 = FScanner::Compare(&sc,"gr_fogcolor");
            if (bVar2) {
              FScanner::MustGetString(&sc);
              lVar6 = strtol(sc.String,(char **)0x0,0x10);
              level.fadeto = (DWORD)lVar6;
            }
            else {
              do {
                bVar2 = FScanner::GetString(&sc);
                if (!bVar2) break;
                bVar2 = FScanner::Compare(&sc,";");
              } while (!bVar2);
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void FS_EmulateCmd(char * string)
{
	FScanner sc;
	sc.OpenMem("RUNCMD", string, (int)strlen(string));
	while (sc.GetString())
	{
		if (sc.Compare("GIMME"))
		{
			while (sc.GetString())
			{
				if (!sc.Compare(";")) FS_Gimme(sc.String);
				else break;
			}
		}
		else if (sc.Compare("ALLOWJUMP"))
		{
			sc.MustGetNumber();
			if (sc.Number) dmflags = dmflags & ~DF_NO_JUMP;
			else dmflags=dmflags | DF_NO_JUMP;
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
		else if (sc.Compare("gravity"))
		{
			sc.MustGetFloat();
			level.gravity=(float)(sc.Float*800);
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
		else if (sc.Compare("viewheight"))
		{
			sc.MustGetFloat();
			double playerviewheight = sc.Float;
			for(int i=0;i<MAXPLAYERS;i++)
			{
				// No, this is not correct. But this is the way Legacy WADs expect it to be handled!
				if (players[i].mo != NULL) players[i].mo->ViewHeight = playerviewheight;
				players[i].viewheight = playerviewheight;
				players[i].Uncrouch();
			}
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
		else if (sc.Compare("map"))
		{
			FS_MapCmd(sc);
		}
		else if (sc.Compare("gr_fogdensity"))
		{
			sc.MustGetNumber();
			// Using this disables most MAPINFO fog options!
			Renderer->SetFogParams(sc.Number*70/400, 0xff000000, 0, 0);
		}
		else if (sc.Compare("gr_fogcolor"))
		{
			sc.MustGetString();
			level.fadeto = strtol(sc.String, NULL, 16);
		}

		else
		{
			// Skip unhandled commands
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
	}
}